

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O1

void __thiscall
QMessageBoxDetailsText::QMessageBoxDetailsText(QMessageBoxDetailsText *this,QWidget *parent)

{
  TextEdit *pTVar1;
  QLayout *this_00;
  QWidget *pQVar2;
  undefined4 *puVar3;
  long in_FS_OFFSET;
  code *local_60;
  ImplFn local_58;
  QObject local_50 [8];
  QMargins local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::QWidget(&this->super_QWidget,parent,(WindowFlags)0x0);
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_00812878;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QMessageBoxDetailsText_00812a28;
  this->copyAvailable = false;
  this_00 = (QLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout((QVBoxLayout *)this_00);
  local_48.m_left.m_i = 0;
  local_48.m_top.m_i = 0;
  local_48.m_right.m_i = 0;
  local_48.m_bottom.m_i = 0;
  QLayout::setContentsMargins(this_00,&local_48);
  pQVar2 = (QWidget *)operator_new(0x28);
  QFrame::QFrame((QFrame *)pQVar2,&this->super_QWidget,(WindowFlags)0x0);
  QFrame::setFrameShape((QFrame *)pQVar2,HLine);
  QFrame::setFrameShadow((QFrame *)pQVar2,Sunken);
  QBoxLayout::addWidget((QBoxLayout *)this_00,pQVar2,0,(Alignment)0x0);
  pQVar2 = (QWidget *)operator_new(0x28);
  QTextEdit::QTextEdit((QTextEdit *)pQVar2,(QWidget *)0x0);
  *(undefined ***)pQVar2 = &PTR_metaObject_00812ba0;
  *(undefined ***)&pQVar2->super_QPaintDevice = &PTR__TextEdit_00812da0;
  this->textEdit = (TextEdit *)pQVar2;
  QWidget::setFixedHeight(pQVar2,100);
  QWidget::setFocusPolicy((QWidget *)this->textEdit,NoFocus);
  QTextEdit::setReadOnly(&this->textEdit->super_QTextEdit,true);
  QBoxLayout::addWidget((QBoxLayout *)this_00,(QWidget *)this->textEdit,0,(Alignment)0x0);
  QWidget::setLayout(&this->super_QWidget,this_00);
  pTVar1 = this->textEdit;
  local_60 = textCopyAvailable;
  local_58 = (ImplFn)0x0;
  local_48._0_8_ = QTextEdit::copyAvailable;
  local_48.m_right.m_i = 0;
  local_48.m_bottom.m_i = 0;
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::
       QCallableObject<void_(QMessageBoxDetailsText::*)(bool),_QtPrivate::List<bool>,_void>::impl;
  *(code **)(puVar3 + 4) = textCopyAvailable;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_50,(void **)pTVar1,(QObject *)&local_48,(void **)this,
             (QSlotObjectBase *)&local_60,(ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QMessageBoxDetailsText(QWidget *parent=nullptr)
        : QWidget(parent)
        , copyAvailable(false)
    {
        QVBoxLayout *layout = new QVBoxLayout;
        layout->setContentsMargins(QMargins());
        QFrame *line = new QFrame(this);
        line->setFrameShape(QFrame::HLine);
        line->setFrameShadow(QFrame::Sunken);
        layout->addWidget(line);
        textEdit = new TextEdit();
        textEdit->setFixedHeight(100);
        textEdit->setFocusPolicy(Qt::NoFocus);
        textEdit->setReadOnly(true);
        layout->addWidget(textEdit);
        setLayout(layout);

        connect(textEdit, &TextEdit::copyAvailable,
                this, &QMessageBoxDetailsText::textCopyAvailable);
    }